

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sequential_attribute_decoder.cc
# Opt level: O0

bool __thiscall
draco::SequentialAttributeDecoder::Init
          (SequentialAttributeDecoder *this,PointCloudDecoder *decoder,int attribute_id)

{
  PointAttribute *pPVar1;
  undefined4 in_EDX;
  GeometryMetadata *in_RSI;
  PointCloud *in_RDI;
  int32_t in_stack_ffffffffffffffdc;
  
  (in_RDI->metadata_)._M_t.
  super___uniq_ptr_impl<draco::GeometryMetadata,_std::default_delete<draco::GeometryMetadata>_>._M_t
  .super__Tuple_impl<0UL,_draco::GeometryMetadata_*,_std::default_delete<draco::GeometryMetadata>_>.
  super__Head_base<0UL,_draco::GeometryMetadata_*,_false>._M_head_impl = in_RSI;
  PointCloudDecoder::point_cloud((PointCloudDecoder *)in_RSI);
  pPVar1 = PointCloud::attribute(in_RDI,in_stack_ffffffffffffffdc);
  (in_RDI->attributes_).
  super__Vector_base<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>,_std::allocator<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)pPVar1;
  *(undefined4 *)
   &(in_RDI->attributes_).
    super__Vector_base<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>,_std::allocator<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = in_EDX;
  return true;
}

Assistant:

bool SequentialAttributeDecoder::Init(PointCloudDecoder *decoder,
                                      int attribute_id) {
  decoder_ = decoder;
  attribute_ = decoder->point_cloud()->attribute(attribute_id);
  attribute_id_ = attribute_id;
  return true;
}